

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestCase * __thiscall testing::UnitTest::GetMutableTestCase(UnitTest *this,int i)

{
  TestCase *pTVar1;
  
  pTVar1 = internal::UnitTestImpl::GetMutableTestCase(this->impl_,i);
  return pTVar1;
}

Assistant:

TestCase* UnitTest::GetMutableTestCase(int i) {
  return impl()->GetMutableTestCase(i);
}